

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O0

LY_ERR lyplg_type_validate_xpath10
                 (ly_ctx *UNUSED_ctx,lysc_type *UNUSED_type,lyd_node *ctx_node,lyd_node *UNUSED_tree
                 ,lyd_value *storage,ly_err_item **err)

{
  int iVar1;
  lyd_node *plVar2;
  char *pref_00;
  char *uri_00;
  ly_err_item *plVar3;
  ly_ctx *local_98;
  lysc_node *local_90;
  lysc_node *local_88;
  lysc_node *local_80;
  ly_err_item *eitem;
  char *uri;
  char *pref;
  ly_set *plStack_58;
  uint32_t i;
  ly_set *set;
  lyd_value_xpath10 *val;
  ly_err_item **pplStack_40;
  LY_ERR ret;
  ly_err_item **err_local;
  lyd_value *storage_local;
  lyd_node *UNUSED_tree_local;
  lyd_node *ctx_node_local;
  lysc_type *UNUSED_type_local;
  ly_ctx *UNUSED_ctx_local;
  
  val._4_4_ = 0;
  plStack_58 = (ly_set *)0x0;
  *err = (ly_err_item *)0x0;
  set = (ly_set *)(storage->field_2).enum_item;
  if (*(int *)&((lysc_type_bitenum_item *)set)->exts == 6) {
    pplStack_40 = err;
    err_local = (ly_err_item **)storage;
    storage_local = (lyd_value *)UNUSED_tree;
    UNUSED_tree_local = ctx_node;
    ctx_node_local = (lyd_node *)UNUSED_type;
    UNUSED_type_local = (lysc_type *)UNUSED_ctx;
    if (((lysc_type_bitenum_item *)set)->ref == (char *)0x0) {
      __assert_fail("val->prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x184,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    if (ctx_node->schema == (lysc_node *)0x0) {
      local_80 = ctx_node[1].schema;
    }
    else {
      local_80 = (lysc_node *)ctx_node->schema->name;
    }
    iVar1 = strcmp((char *)local_80,"parent-reference");
    if ((iVar1 != 0) ||
       (iVar1 = strcmp(UNUSED_tree_local->schema->module->name,"ietf-yang-schema-mount"), iVar1 != 0
       )) {
      __assert_fail("!strcmp(LYD_NAME(ctx_node), \"parent-reference\") && !strcmp(ctx_node->schema->module->name, \"ietf-yang-schema-mount\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x188,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    val._4_4_ = lyd_find_xpath(UNUSED_tree_local,"../../../namespace",&stack0xffffffffffffffa8);
    if (val._4_4_ == LY_SUCCESS) {
      for (pref._4_4_ = 0; pref._4_4_ < plStack_58->count; pref._4_4_ = pref._4_4_ + 1) {
        plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
        if (plVar2->schema == (lysc_node *)0x0) {
          plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
          local_88 = plVar2[1].schema;
        }
        else {
          plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
          local_88 = (lysc_node *)plVar2->schema->name;
        }
        iVar1 = strcmp((char *)local_88,"prefix");
        if (iVar1 != 0) {
          __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), \"prefix\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                        ,400,
                        "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                       );
        }
        plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
        pref_00 = lyd_get_value(plVar2);
        plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
        if (plVar2->next != (lyd_node *)0x0) {
          plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
          if (plVar2->next->schema == (lysc_node *)0x0) {
            plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
            local_90 = plVar2->next[1].schema;
          }
          else {
            plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
            local_90 = (lysc_node *)plVar2->next->schema->name;
          }
          iVar1 = strcmp((char *)local_90,"uri");
          if (iVar1 != 0) {
            __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), \"uri\")",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                          ,0x197,
                          "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                         );
          }
          plVar2 = lyd_child((plStack_58->field_2).dnodes[pref._4_4_]);
          uri_00 = lyd_get_value(plVar2->next);
          val._4_4_ = xpath10_add_ns(*(ly_set **)(set + 1),pref_00,uri_00);
          if (val._4_4_ != LY_SUCCESS) break;
        }
      }
    }
    ly_set_free(plStack_58,(_func_void_void_ptr *)0x0);
    if (val._4_4_ == LY_EMEM) {
      ly_err_new(pplStack_40,LY_EMEM,LYVE_DATA,(char *)0x0,(char *)0x0,"Memory allocation failed.");
    }
    else if (val._4_4_ != LY_SUCCESS) {
      if (UNUSED_tree_local->schema == (lysc_node *)0x0) {
        local_98 = (ly_ctx *)UNUSED_tree_local[2].schema;
      }
      else {
        local_98 = UNUSED_tree_local->schema->module->ctx;
      }
      plVar3 = ly_err_last(local_98);
      ly_err_new(pplStack_40,val._4_4_,LYVE_DATA,plVar3->data_path,(char *)0x0,"%s",plVar3->msg);
    }
    UNUSED_ctx_local._4_4_ = val._4_4_;
  }
  else {
    UNUSED_ctx_local._4_4_ = LY_SUCCESS;
  }
  return UNUSED_ctx_local._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_validate_xpath10(const struct ly_ctx *UNUSED(ctx), const struct lysc_type *UNUSED(type),
        const struct lyd_node *ctx_node, const struct lyd_node *UNUSED(tree), struct lyd_value *storage,
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_value_xpath10 *val;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *pref, *uri;
    const struct ly_err_item *eitem;

    *err = NULL;
    LYD_VALUE_GET(storage, val);

    if (val->format != LY_VALUE_STR_NS) {
        /* nothing to validate */
        return LY_SUCCESS;
    }

    /* the XML namespace set must exist */
    assert(val->prefix_data);

    /* special handling of this particular node */
    assert(!strcmp(LYD_NAME(ctx_node), "parent-reference") &&
            !strcmp(ctx_node->schema->module->name, "ietf-yang-schema-mount"));

    /* get all the prefix mappings */
    if ((ret = lyd_find_xpath(ctx_node, "../../../namespace", &set))) {
        goto cleanup;
    }

    for (i = 0; i < set->count; ++i) {
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), "prefix"));
        pref = lyd_get_value(lyd_child(set->dnodes[i]));

        if (!lyd_child(set->dnodes[i])->next) {
            /* missing URI - invalid mapping, skip */
            continue;
        }
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), "uri"));
        uri = lyd_get_value(lyd_child(set->dnodes[i])->next);

        /* new NS */
        if ((ret = xpath10_add_ns(val->prefix_data, pref, uri))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(set, NULL);
    if (ret == LY_EMEM) {
        ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, LY_EMEM_MSG);
    } else if (ret) {
        eitem = ly_err_last(LYD_CTX(ctx_node));
        ly_err_new(err, ret, LYVE_DATA, eitem->data_path, NULL, "%s", eitem->msg);
    }
    return ret;
}